

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

void t_results_queue_destroy(t_results_queue *q)

{
  t_results_queue *q_local;
  
  if (q != (t_results_queue *)0x0) {
    pthread_mutex_destroy((pthread_mutex_t *)&q->result_m);
    pthread_cond_destroy((pthread_cond_t *)&q->result_avail_c);
    memset(q,0xbb,0x78);
    free(q);
  }
  return;
}

Assistant:

void t_results_queue_destroy(t_results_queue *q) {
#ifdef DEBUG
    fprintf(stderr, "Destroying results queue %p\n", q);
#endif

    if (!q)
	return;

    pthread_mutex_destroy(&q->result_m);
    pthread_cond_destroy(&q->result_avail_c);

    memset(q, 0xbb, sizeof(*q));
    free(q);

#ifdef DEBUG
    fprintf(stderr, "Destroyed results queue %p\n", q);
#endif
}